

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O0

void __thiscall Mapper::Mapper(Mapper *this)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  allocator<char> local_859;
  key_type local_858;
  int local_834 [2];
  pair<int,_int> local_82c;
  allocator<char> local_821;
  key_type local_820;
  int local_7fc [2];
  pair<int,_int> local_7f4;
  allocator<char> local_7e9;
  key_type local_7e8;
  int local_7c4 [2];
  pair<int,_int> local_7bc;
  allocator<char> local_7b1;
  key_type local_7b0;
  int local_78c [2];
  pair<int,_int> local_784;
  allocator<char> local_779;
  key_type local_778;
  int local_754 [2];
  pair<int,_int> local_74c;
  allocator<char> local_741;
  key_type local_740;
  int local_71c [2];
  pair<int,_int> local_714;
  allocator<char> local_709;
  key_type local_708;
  int local_6e4 [2];
  pair<int,_int> local_6dc;
  allocator<char> local_6d1;
  key_type local_6d0;
  int local_6ac [2];
  pair<int,_int> local_6a4;
  allocator<char> local_699;
  key_type local_698;
  int local_674 [2];
  pair<int,_int> local_66c;
  allocator<char> local_661;
  key_type local_660;
  int local_63c [2];
  pair<int,_int> local_634;
  allocator<char> local_629;
  key_type local_628;
  int local_604 [2];
  pair<int,_int> local_5fc;
  allocator<char> local_5f1;
  key_type local_5f0;
  int local_5cc [2];
  pair<int,_int> local_5c4;
  allocator<char> local_5b9;
  key_type local_5b8;
  int local_594 [2];
  pair<int,_int> local_58c;
  allocator<char> local_581;
  key_type local_580;
  int local_55c [2];
  pair<int,_int> local_554;
  allocator<char> local_549;
  key_type local_548;
  int local_524 [2];
  pair<int,_int> local_51c;
  allocator<char> local_511;
  key_type local_510;
  int local_4ec [2];
  pair<int,_int> local_4e4;
  allocator<char> local_4d9;
  key_type local_4d8;
  int local_4b4 [2];
  pair<int,_int> local_4ac;
  allocator<char> local_4a1;
  key_type local_4a0;
  int local_47c [2];
  pair<int,_int> local_474;
  allocator<char> local_469;
  key_type local_468;
  int local_444 [2];
  pair<int,_int> local_43c;
  allocator<char> local_431;
  key_type local_430;
  int local_40c [2];
  pair<int,_int> local_404;
  allocator<char> local_3f9;
  key_type local_3f8;
  int local_3d4 [2];
  pair<int,_int> local_3cc;
  allocator<char> local_3c1;
  key_type local_3c0;
  int local_39c [2];
  pair<int,_int> local_394;
  allocator<char> local_389;
  key_type local_388;
  int local_364 [2];
  pair<int,_int> local_35c;
  allocator<char> local_351;
  key_type local_350;
  int local_32c [2];
  pair<int,_int> local_324;
  allocator<char> local_319;
  key_type local_318;
  int local_2f4 [2];
  pair<int,_int> local_2ec;
  allocator<char> local_2e1;
  key_type local_2e0;
  int local_2bc [2];
  pair<int,_int> local_2b4;
  allocator<char> local_2a9;
  key_type local_2a8;
  int local_284 [2];
  pair<int,_int> local_27c;
  allocator<char> local_271;
  key_type local_270;
  int local_24c [2];
  pair<int,_int> local_244;
  allocator<char> local_239;
  key_type local_238;
  int local_214 [2];
  pair<int,_int> local_20c;
  allocator<char> local_201;
  key_type local_200;
  int local_1dc [2];
  pair<int,_int> local_1d4;
  allocator<char> local_1c9;
  key_type local_1c8;
  int local_1a4 [2];
  pair<int,_int> local_19c;
  allocator<char> local_191;
  key_type local_190;
  int local_16c [2];
  pair<int,_int> local_164;
  allocator<char> local_159;
  key_type local_158;
  allocator<char> local_131;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  allocator<char> local_e1;
  key_type local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  allocator<char> local_91;
  key_type local_90;
  allocator<char> local_69;
  key_type local_68;
  allocator<char> local_31;
  key_type local_30;
  Mapper *local_10;
  Mapper *this_local;
  
  local_10 = this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
  ::unordered_map(&this->opcodeMap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::unordered_map(&this->registerMap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"reg0",&local_31);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_30);
  *pmVar1 = '\0';
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"reg1",&local_69);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_68);
  *pmVar1 = '\x01';
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"reg2",&local_91);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_90);
  *pmVar1 = '\x02';
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"reg3",&local_b9);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_b8);
  *pmVar1 = '\x03';
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"reg4",&local_e1);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_e0);
  *pmVar1 = '\x04';
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"reg5",&local_109);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_108);
  *pmVar1 = '\x05';
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"bp",&local_131);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_130);
  *pmVar1 = '\x06';
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"esp",&local_159);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::operator[](&this->registerMap,&local_158);
  *pmVar1 = '\a';
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_16c[1] = 0;
  local_16c[0] = 2;
  local_164 = std::make_pair<int,int>(local_16c + 1,local_16c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"mov",&local_191);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_190);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_164);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  local_1a4[1] = 1;
  local_1a4[0] = 2;
  local_19c = std::make_pair<int,int>(local_1a4 + 1,local_1a4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"add",&local_1c9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_1c8);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_19c);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  local_1dc[1] = 2;
  local_1dc[0] = 2;
  local_1d4 = std::make_pair<int,int>(local_1dc + 1,local_1dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"sub",&local_201);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_200);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_1d4);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  local_214[1] = 3;
  local_214[0] = 2;
  local_20c = std::make_pair<int,int>(local_214 + 1,local_214);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"and",&local_239);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_238);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_20c);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  local_24c[1] = 4;
  local_24c[0] = 2;
  local_244 = std::make_pair<int,int>(local_24c + 1,local_24c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"or",&local_271);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_270);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_244);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  local_284[1] = 5;
  local_284[0] = 2;
  local_27c = std::make_pair<int,int>(local_284 + 1,local_284);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"xor",&local_2a9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_2a8);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_27c);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  local_2bc[1] = 6;
  local_2bc[0] = 2;
  local_2b4 = std::make_pair<int,int>(local_2bc + 1,local_2bc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"sar",&local_2e1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_2e0);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_2b4);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  local_2f4[1] = 7;
  local_2f4[0] = 2;
  local_2ec = std::make_pair<int,int>(local_2f4 + 1,local_2f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"sal",&local_319);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_318);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_2ec);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  local_32c[1] = 8;
  local_32c[0] = 2;
  local_324 = std::make_pair<int,int>(local_32c + 1,local_32c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"ror",&local_351);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_350);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_324);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  local_364[1] = 9;
  local_364[0] = 2;
  local_35c = std::make_pair<int,int>(local_364 + 1,local_364);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"rol",&local_389);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_388);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_35c);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  local_39c[1] = 10;
  local_39c[0] = 2;
  local_394 = std::make_pair<int,int>(local_39c + 1,local_39c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"mul",&local_3c1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_3c0);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_394);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  local_3d4[1] = 0xb;
  local_3d4[0] = 2;
  local_3cc = std::make_pair<int,int>(local_3d4 + 1,local_3d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"div",&local_3f9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_3f8);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_3cc);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  local_40c[1] = 0xc;
  local_40c[0] = 2;
  local_404 = std::make_pair<int,int>(local_40c + 1,local_40c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"mod",&local_431);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_430);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_404);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  local_444[1] = 0xd;
  local_444[0] = 2;
  local_43c = std::make_pair<int,int>(local_444 + 1,local_444);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"cmp",&local_469);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_468);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_43c);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  local_47c[1] = 0xe;
  local_47c[0] = 1;
  local_474 = std::make_pair<int,int>(local_47c + 1,local_47c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"jz",&local_4a1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_4a0);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_474);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  local_4b4[1] = 0xf;
  local_4b4[0] = 1;
  local_4ac = std::make_pair<int,int>(local_4b4 + 1,local_4b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"jnz",&local_4d9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_4d8);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_4ac);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  local_4ec[1] = 0x10;
  local_4ec[0] = 1;
  local_4e4 = std::make_pair<int,int>(local_4ec + 1,local_4ec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"jg",&local_511);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_510);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_4e4);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  local_524[1] = 0x11;
  local_524[0] = 1;
  local_51c = std::make_pair<int,int>(local_524 + 1,local_524);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"js",&local_549);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_548);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_51c);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  local_55c[1] = 0x12;
  local_55c[0] = 1;
  local_554 = std::make_pair<int,int>(local_55c + 1,local_55c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"jmp",&local_581);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_580);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_554);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  local_594[1] = 0x13;
  local_594[0] = 1;
  local_58c = std::make_pair<int,int>(local_594 + 1,local_594);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"not",&local_5b9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_5b8);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_58c);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  local_5cc[1] = 0x14;
  local_5cc[0] = 1;
  local_5c4 = std::make_pair<int,int>(local_5cc + 1,local_5cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"inc",&local_5f1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_5f0);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_5c4);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  local_604[1] = 0x15;
  local_604[0] = 1;
  local_5fc = std::make_pair<int,int>(local_604 + 1,local_604);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"dec",&local_629);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_628);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_5fc);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  local_63c[1] = 0x16;
  local_63c[0] = 0;
  local_634 = std::make_pair<int,int>(local_63c + 1,local_63c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"ret",&local_661);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_660);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_634);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  local_674[1] = 0x17;
  local_674[0] = 1;
  local_66c = std::make_pair<int,int>(local_674 + 1,local_674);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"call",&local_699);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_698);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_66c);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  local_6ac[1] = 0x18;
  local_6ac[0] = 1;
  local_6a4 = std::make_pair<int,int>(local_6ac + 1,local_6ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"push",&local_6d1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_6d0);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_6a4);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  local_6e4[1] = 0x19;
  local_6e4[0] = 1;
  local_6dc = std::make_pair<int,int>(local_6e4 + 1,local_6e4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"pop",&local_709);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_708);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_6dc);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  local_71c[1] = 0x1a;
  local_71c[0] = 0;
  local_714 = std::make_pair<int,int>(local_71c + 1,local_71c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"halt",&local_741);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_740);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_714);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  local_754[1] = 0x1b;
  local_754[0] = 1;
  local_74c = std::make_pair<int,int>(local_754 + 1,local_754);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"printi",&local_779);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_778);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_74c);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  local_78c[1] = 0x1c;
  local_78c[0] = 1;
  local_784 = std::make_pair<int,int>(local_78c + 1,local_78c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"prints",&local_7b1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_7b0);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_784);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  local_7c4[1] = 0x1d;
  local_7c4[0] = 1;
  local_7bc = std::make_pair<int,int>(local_7c4 + 1,local_7c4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"printc",&local_7e9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_7e8);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_7bc);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  local_7fc[1] = 0x1e;
  local_7fc[0] = 1;
  local_7f4 = std::make_pair<int,int>(local_7fc + 1,local_7fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"syscall",&local_821);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_820);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_7f4);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator(&local_821);
  local_834[1] = 0x1f;
  local_834[0] = 1;
  local_82c = std::make_pair<int,int>(local_834 + 1,local_834);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"memcpy",&local_859);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,&local_858);
  std::pair<unsigned_char,unsigned_int>::operator=
            ((pair<unsigned_char,unsigned_int> *)pmVar2,&local_82c);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  return;
}

Assistant:

Mapper::Mapper() {
	registerMap["reg0"] = 0x00;
	registerMap["reg1"] = 0x01;
	registerMap["reg2"] = 0x02;
	registerMap["reg3"] = 0x03;
	registerMap["reg4"] = 0x04;
	registerMap["reg5"] = 0x05;
	registerMap["bp"] = 0x06;
	registerMap["esp"]  = 0x07;

	opcodeMap["mov"]	= std::make_pair(0, 2);
	opcodeMap["add"]	= std::make_pair(1, 2);
	opcodeMap["sub"]	= std::make_pair(2, 2);
	opcodeMap["and"]	= std::make_pair(3, 2);
	opcodeMap["or"]		= std::make_pair(4, 2);
	opcodeMap["xor"]	= std::make_pair(5, 2);
	opcodeMap["sar"]	= std::make_pair(6, 2);
	opcodeMap["sal"]	= std::make_pair(7, 2);
	opcodeMap["ror"]	= std::make_pair(8, 2);
	opcodeMap["rol"]	= std::make_pair(9, 2);
	opcodeMap["mul"]    = std::make_pair(10, 2);
	opcodeMap["div"]    = std::make_pair(11, 2);
	opcodeMap["mod"]    = std::make_pair(12, 2);
	opcodeMap["cmp"]	= std::make_pair(13, 2);

	opcodeMap["jz"]		= std::make_pair(14, 1);
	opcodeMap["jnz"]	= std::make_pair(15, 1);
	opcodeMap["jg"]		= std::make_pair(16, 1);
	opcodeMap["js"]		= std::make_pair(17, 1);
	opcodeMap["jmp"]	= std::make_pair(18, 1);
	opcodeMap["not"]	= std::make_pair(19, 1);
	opcodeMap["inc"]	= std::make_pair(20, 1);
	opcodeMap["dec"]	= std::make_pair(21, 1);
	opcodeMap["ret"]	= std::make_pair(22, 0);

	opcodeMap["call"]	= std::make_pair(23, 1);
	opcodeMap["push"]	= std::make_pair(24, 1);
	opcodeMap["pop"]	= std::make_pair(25, 1);
	opcodeMap["halt"]	= std::make_pair(26, 0);
	opcodeMap["printi"]	= std::make_pair(27, 1);
	opcodeMap["prints"]	= std::make_pair(28, 1);
	opcodeMap["printc"] = std::make_pair(29, 1);
	opcodeMap["syscall"] = std::make_pair(30, 1);
	opcodeMap["memcpy"]= std::make_pair(31, 1);
}